

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.h
# Opt level: O1

ImGuiListClipperRange * __thiscall
ImVector<ImGuiListClipperRange>::insert
          (ImVector<ImGuiListClipperRange> *this,ImGuiListClipperRange *it,ImGuiListClipperRange *v)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  ImGuiListClipperRange *pIVar4;
  ImGuiListClipperRange *pIVar5;
  long lVar6;
  int iVar7;
  long lVar8;
  int iVar9;
  
  pIVar5 = this->Data;
  if ((pIVar5 <= it) && (iVar2 = this->Size, it <= pIVar5 + iVar2)) {
    lVar8 = (long)it - (long)pIVar5;
    iVar3 = this->Capacity;
    if (iVar2 == iVar3) {
      if (iVar3 == 0) {
        iVar7 = 8;
      }
      else {
        iVar7 = iVar3 / 2 + iVar3;
      }
      iVar9 = iVar2 + 1;
      if (iVar2 + 1 < iVar7) {
        iVar9 = iVar7;
      }
      if (iVar3 < iVar9) {
        if (GImGui != (ImGuiContext *)0x0) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + 1;
        }
        pIVar5 = (ImGuiListClipperRange *)
                 (*GImAllocatorAllocFunc)((long)iVar9 * 0xc,GImAllocatorUserData);
        if (this->Data != (ImGuiListClipperRange *)0x0) {
          memcpy(pIVar5,this->Data,(long)this->Size * 0xc);
          pIVar4 = this->Data;
          if ((pIVar4 != (ImGuiListClipperRange *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
            piVar1 = &(GImGui->IO).MetricsActiveAllocations;
            *piVar1 = *piVar1 + -1;
          }
          (*GImAllocatorFreeFunc)(pIVar4,GImAllocatorUserData);
        }
        this->Data = pIVar5;
        this->Capacity = iVar9;
      }
    }
    lVar6 = (long)this->Size + (lVar8 >> 2) * 0x5555555555555555;
    if (lVar6 != 0 && (lVar8 >> 2) * -0x5555555555555555 <= (long)this->Size) {
      memmove((void *)((long)this->Data + lVar8 + 0xc),(void *)((long)this->Data + lVar8),
              lVar6 * 0xc);
    }
    pIVar5 = this->Data;
    *(undefined4 *)((long)pIVar5 + lVar8 + 8) = *(undefined4 *)&v->PosToIndexConvert;
    *(undefined8 *)((long)pIVar5 + lVar8) = *(undefined8 *)v;
    this->Size = this->Size + 1;
    return (ImGuiListClipperRange *)(lVar8 + (long)this->Data);
  }
  __assert_fail("it >= Data && it <= Data + Size",
                "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/imgui-src/imgui.h"
                ,0x769,
                "T *ImVector<ImGuiListClipperRange>::insert(const T *, const T &) [T = ImGuiListClipperRange]"
               );
}

Assistant:

inline T*           insert(const T* it, const T& v)     { IM_ASSERT(it >= Data && it <= Data + Size); const ptrdiff_t off = it - Data; if (Size == Capacity) reserve(_grow_capacity(Size + 1)); if (off < (int)Size) memmove(Data + off + 1, Data + off, ((size_t)Size - (size_t)off) * sizeof(T)); memcpy(&Data[off], &v, sizeof(v)); Size++; return Data + off; }